

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

pair<const_int_*,_bool>
HighsHashTree<int,_void>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,HighsHashTableEntry<int,_void> *entry)

{
  int *piVar1;
  byte bVar2;
  pair<const_int_*,_bool> pVar3;
  int i;
  InnerLeaf<1> *this;
  ValueType *pVVar6;
  uint uVar4;
  int iVar5;
  long lVar7;
  undefined8 *puVar8;
  sbyte sVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 extraout_RDX_03;
  int i_2;
  ulong uVar12;
  int i_4;
  int iVar13;
  undefined8 *puVar14;
  ulong uVar15;
  uint numChilds;
  int *piVar16;
  long lVar17;
  array<HighsHashTableEntry<int,_void>,_54UL> *paVar18;
  int i_1;
  InnerLeaf<4> *this_00;
  BranchNode *pBVar19;
  pair<const_int_*,_bool> pVar20;
  pair<const_int_*,_bool> pVar21;
  pair<const_int_*,_bool> pVar22;
  ulong uStack_b0;
  undefined8 local_70;
  array<unsigned_char,_55UL> sizes;
  
  uVar12 = insertNode->ptrAndType;
  switch((uint)uVar12 & 7) {
  case 0:
    if (hashPos != 9) {
      this = (InnerLeaf<1> *)operator_new(0x60);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar20 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
      return pVar20;
    }
    puVar8 = (undefined8 *)operator_new(0x18);
    *puVar8 = 0;
    piVar16 = (int *)(puVar8 + 1);
    *(int *)(puVar8 + 1) = entry->value_;
    *(undefined4 *)(puVar8 + 2) = 1;
    insertNode->ptrAndType = (ulong)puVar8 | 1;
    uVar10 = extraout_RDX;
    goto LAB_002884a9;
  case 1:
    iVar13 = entry->value_;
    puVar8 = (undefined8 *)(uVar12 & 0xfffffffffffffff8);
    do {
      puVar14 = puVar8;
      if (*(int *)(puVar14 + 1) == iVar13) {
        pVar3._8_8_ = 0;
        pVar3.first = (int *)(puVar14 + 1);
        return pVar3;
      }
      puVar8 = (undefined8 *)*puVar14;
    } while ((undefined8 *)*puVar14 != (undefined8 *)0x0);
    puVar8 = (undefined8 *)operator_new(0x10);
    *puVar8 = 0;
    piVar16 = (int *)(puVar8 + 1);
    *(int *)(puVar8 + 1) = iVar13;
    *puVar14 = puVar8;
    piVar1 = (int *)((undefined8 *)(uVar12 & 0xfffffffffffffff8) + 2);
    *piVar1 = *piVar1 + 1;
    uVar10 = extraout_RDX_00;
    goto LAB_002884a9;
  case 2:
    pVar21 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar12 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar21 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar12 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar21 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar12 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar12 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar20 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      return pVar20;
    }
    pVVar6 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->value_);
    if (pVVar6 != (ValueType *)0x0) {
      pVar20._8_8_ = 0;
      pVar20.first = pVVar6;
      return pVar20;
    }
    uVar4 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar12 = (this_00->occupation).occupation | 1L << (ulong)uVar4;
    lVar17 = POPCOUNT(uVar12);
    numChilds = (uint)lVar17;
    pBVar19 = createBranchingNode(numChilds);
    insertNode->ptrAndType = (ulong)pBVar19 | 6;
    (pBVar19->occupation).occupation = uVar12;
    iVar13 = hashPos + 1;
    sVar9 = (sbyte)uVar4;
    if (iVar13 != 9) {
      if (numChilds < 2) {
        insertNode = pBVar19->child;
        pBVar19->child[0].ptrAndType = (ulong)this_00 | 5;
        InnerLeaf<4>::rehash(this_00,iVar13);
      }
      else {
        uVar4 = this_00->size;
        local_70 = (ulong)uVar4;
        iVar5 = (uVar4 - numChilds) + 2;
        if (iVar5 < 7) {
          for (lVar7 = 0; lVar17 != lVar7; lVar7 = lVar7 + 1) {
            puVar8 = (undefined8 *)operator_new(0x60);
            *puVar8 = 0;
            *(undefined4 *)(puVar8 + 1) = 0;
            puVar8[2] = 0;
            pBVar19->child[lVar7].ptrAndType = (ulong)puVar8 | 2;
          }
          paVar18 = &this_00->entries;
          uVar15 = local_70;
          for (lVar17 = 0; lVar17 < (int)uVar15; lVar17 = lVar17 + 1) {
            uVar15 = (ulong)(uint)paVar18->_M_elems[0].value_;
            InnerLeaf<1>::insert_entry
                      ((InnerLeaf<1> *)
                       (pBVar19->child
                        [POPCOUNT(uVar12 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar17] >> 10)
                                            & 0x3f)) + -1].ptrAndType & 0xfffffffffffffff8),
                       uVar15 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                       uVar15 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,paVar18->_M_elems);
            uVar15 = (ulong)(uint)this_00->size;
            paVar18 = (array<HighsHashTableEntry<int,_void>,_54UL> *)(paVar18->_M_elems + 1);
          }
          operator_delete(this_00);
          pVar22 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)
                              (pBVar19->child[POPCOUNT(uVar12 >> sVar9) + -1].ptrAndType &
                              0xfffffffffffffff8),hash,iVar13,entry);
          iVar13 = hashPos;
        }
        else {
          sizes._M_elems[0x20] = '\0';
          sizes._M_elems[0x21] = '\0';
          sizes._M_elems[0x22] = '\0';
          sizes._M_elems[0x23] = '\0';
          sizes._M_elems[0x24] = '\0';
          sizes._M_elems[0x25] = '\0';
          sizes._M_elems[0x26] = '\0';
          sizes._M_elems[0x27] = '\0';
          sizes._M_elems[0x28] = '\0';
          sizes._M_elems[0x29] = '\0';
          sizes._M_elems[0x2a] = '\0';
          sizes._M_elems[0x2b] = '\0';
          sizes._M_elems[0x2c] = '\0';
          sizes._M_elems[0x2d] = '\0';
          sizes._M_elems[0x2e] = '\0';
          sizes._M_elems[0x10] = '\0';
          sizes._M_elems[0x11] = '\0';
          sizes._M_elems[0x12] = '\0';
          sizes._M_elems[0x13] = '\0';
          sizes._M_elems[0x14] = '\0';
          sizes._M_elems[0x15] = '\0';
          sizes._M_elems[0x16] = '\0';
          sizes._M_elems[0x17] = '\0';
          sizes._M_elems[0x18] = '\0';
          sizes._M_elems[0x19] = '\0';
          sizes._M_elems[0x1a] = '\0';
          sizes._M_elems[0x1b] = '\0';
          sizes._M_elems[0x1c] = '\0';
          sizes._M_elems[0x1d] = '\0';
          sizes._M_elems[0x1e] = '\0';
          sizes._M_elems[0x1f] = '\0';
          sizes._M_elems[0] = '\0';
          sizes._M_elems[1] = '\0';
          sizes._M_elems[2] = '\0';
          sizes._M_elems[3] = '\0';
          sizes._M_elems[4] = '\0';
          sizes._M_elems[5] = '\0';
          sizes._M_elems[6] = '\0';
          sizes._M_elems[7] = '\0';
          sizes._M_elems[8] = '\0';
          sizes._M_elems[9] = '\0';
          sizes._M_elems[10] = '\0';
          sizes._M_elems[0xb] = '\0';
          sizes._M_elems[0xc] = '\0';
          sizes._M_elems[0xd] = '\0';
          sizes._M_elems[0xe] = '\0';
          sizes._M_elems[0xf] = '\0';
          sizes._M_elems[0x2f] = '\0';
          sizes._M_elems[0x30] = '\0';
          sizes._M_elems[0x31] = '\0';
          sizes._M_elems[0x32] = '\0';
          sizes._M_elems[0x33] = '\0';
          sizes._M_elems[0x34] = '\0';
          sizes._M_elems[0x35] = '\0';
          sizes._M_elems[0x36] = '\0';
          sizes._M_elems[POPCOUNT(uVar12 >> sVar9) + -1] =
               sizes._M_elems[POPCOUNT(uVar12 >> sVar9) + -1] + '\x01';
          uVar15 = 0;
          uVar11 = 0;
          if (0 < (int)uVar4) {
            uVar11 = (ulong)uVar4;
          }
          for (; uVar11 != uVar15; uVar15 = uVar15 + 1) {
            sizes._M_elems
            [POPCOUNT(uVar12 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar15] >> 10) & 0x3f)) +
             -1] = sizes._M_elems
                   [POPCOUNT(uVar12 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar15] >> 10) &
                                       0x3f)) + -1] + '\x01';
          }
          for (lVar7 = 0; lVar17 != lVar7; lVar7 = lVar7 + 1) {
            switch(sizes._M_elems[lVar7] + 9 >> 4) {
            case 0:
              puVar8 = (undefined8 *)operator_new(0x60);
              uStack_b0 = 2;
              break;
            case 1:
              puVar8 = (undefined8 *)operator_new(0x120);
              uStack_b0 = 3;
              break;
            case 2:
              puVar8 = (undefined8 *)operator_new(0x1e0);
              uStack_b0 = 4;
              break;
            case 3:
              puVar8 = (undefined8 *)operator_new(0x2a0);
              uStack_b0 = 5;
              break;
            default:
              goto switchD_002888f6_default;
            }
            *puVar8 = 0;
            *(undefined4 *)(puVar8 + 1) = 0;
            puVar8[2] = 0;
            pBVar19->child[lVar7].ptrAndType = uStack_b0 | (ulong)puVar8;
switchD_002888f6_default:
          }
          paVar18 = &this_00->entries;
          uVar15 = local_70;
          for (lVar17 = 0; lVar17 < (int)uVar15; lVar17 = lVar17 + 1) {
            uVar15 = pBVar19->child
                     [POPCOUNT(uVar12 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar17] >> 10) &
                                         0x3f)) + -1].ptrAndType;
            switch((uint)uVar15 & 7) {
            case 2:
              uVar11 = (ulong)(uint)paVar18->_M_elems[0].value_;
              InnerLeaf<1>::insert_entry
                        ((InnerLeaf<1> *)(uVar15 & 0xfffffffffffffff8),
                         uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                         uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,paVar18->_M_elems)
              ;
              break;
            case 3:
              uVar11 = (ulong)(uint)paVar18->_M_elems[0].value_;
              InnerLeaf<2>::insert_entry
                        ((InnerLeaf<2> *)(uVar15 & 0xfffffffffffffff8),
                         uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                         uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,paVar18->_M_elems)
              ;
              break;
            case 4:
              uVar11 = (ulong)(uint)paVar18->_M_elems[0].value_;
              InnerLeaf<3>::insert_entry
                        ((InnerLeaf<3> *)(uVar15 & 0xfffffffffffffff8),
                         uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                         uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,paVar18->_M_elems)
              ;
              break;
            case 5:
              uVar11 = (ulong)(uint)paVar18->_M_elems[0].value_;
              InnerLeaf<4>::insert_entry
                        ((InnerLeaf<4> *)(uVar15 & 0xfffffffffffffff8),
                         uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                         uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,paVar18->_M_elems)
              ;
            }
            uVar15 = (ulong)(uint)this_00->size;
            paVar18 = (array<HighsHashTableEntry<int,_void>,_54UL> *)(paVar18->_M_elems + 1);
          }
          operator_delete(this_00);
          pVar22._8_8_ = extraout_RDX_03;
          pVar22.first = (int *)paVar18;
          insertNode = pBVar19->child + POPCOUNT(uVar12 >> sVar9) + -1;
        }
        if (iVar5 < 7) {
          return pVar22;
        }
      }
      goto LAB_0028859b;
    }
    for (lVar7 = 0; lVar17 != lVar7; lVar7 = lVar7 + 1) {
      pBVar19->child[lVar7].ptrAndType = 0;
    }
    for (lVar17 = 0; lVar17 < this_00->size; lVar17 = lVar17 + 1) {
      lVar7 = POPCOUNT(uVar12 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar17] >> 10) & 0x3f));
      uVar15 = pBVar19->child[lVar7 + -1].ptrAndType;
      if ((uVar15 & 7) == 0) {
        puVar8 = (undefined8 *)operator_new(0x18);
        *puVar8 = 0;
        *(int *)(puVar8 + 1) = (this_00->entries)._M_elems[lVar17].value_;
        *(undefined4 *)(puVar8 + 2) = 1;
        pBVar19->child[lVar7 + -1].ptrAndType = (ulong)puVar8 | 1;
      }
      else {
        puVar14 = (undefined8 *)(uVar15 & 0xfffffffffffffff8);
        puVar8 = (undefined8 *)operator_new(0x10);
        uVar10 = puVar14[1];
        *puVar8 = *puVar14;
        puVar8[1] = uVar10;
        *puVar14 = puVar8;
        *(int *)(puVar14 + 1) = (this_00->entries)._M_elems[lVar17].value_;
        *(int *)(puVar14 + 2) = *(int *)(puVar14 + 2) + 1;
      }
    }
    operator_delete(this_00);
    uVar15 = pBVar19->child[POPCOUNT(uVar12 >> sVar9) + -1].ptrAndType;
    if ((uVar15 & 7) == 0) {
      puVar8 = (undefined8 *)operator_new(0x18);
      *puVar8 = 0;
      *(int *)(puVar8 + 1) = entry->value_;
      *(undefined4 *)(puVar8 + 2) = 1;
      pBVar19->child[POPCOUNT(uVar12 >> sVar9) + -1].ptrAndType = (ulong)puVar8 | 1;
      uVar10 = extraout_RDX_02;
    }
    else {
      puVar8 = (undefined8 *)(uVar15 & 0xfffffffffffffff8);
      puVar14 = (undefined8 *)operator_new(0x10);
      uVar10 = puVar8[1];
      *puVar14 = *puVar8;
      puVar14[1] = uVar10;
      *puVar8 = puVar14;
      *(int *)(puVar8 + 1) = entry->value_;
      *(int *)(puVar8 + 2) = *(int *)(puVar8 + 2) + 1;
      uVar10 = extraout_RDX_01;
    }
    piVar16 = (int *)(puVar8 + 1);
LAB_002884a9:
    pVar21._9_7_ = (int7)((ulong)uVar10 >> 8);
    pVar21.second = true;
    pVar21.first = piVar16;
    break;
  case 6:
    uVar15 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    pBVar19 = (BranchNode *)(uVar12 & 0xfffffffffffffff8);
    uVar12 = (pBVar19->occupation).occupation;
    bVar2 = (byte)uVar15;
    lVar17 = POPCOUNT(uVar12 >> (bVar2 & 0x3f));
    if ((uVar12 >> (uVar15 & 0x3f) & 1) == 0) {
      pBVar19 = addChildToBranchNode(pBVar19,bVar2 & 0x3f,(int)lVar17);
      pBVar19->child[lVar17].ptrAndType = 0;
      (pBVar19->occupation).occupation = (pBVar19->occupation).occupation | 1L << (bVar2 & 0x3f);
    }
    else {
      lVar17 = lVar17 + -1;
    }
    insertNode->ptrAndType = (ulong)pBVar19 | 6;
    iVar13 = hashPos + 1;
    insertNode = pBVar19->child + lVar17;
    goto LAB_0028859b;
  case 7:
    iVar13 = hashPos;
LAB_0028859b:
    pVar21 = insert_recurse(insertNode,hash,iVar13,entry);
  }
  return pVar21;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }